

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

void CoreML::Specification::protobuf_TreeEnsemble_2eproto::TableStruct::Shutdown(void)

{
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>
            *)_TreeEnsembleParameters_TreeNode_EvaluationInfo_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::TreeEnsembleParameters_TreeNode>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::TreeEnsembleParameters_TreeNode> *)
             _TreeEnsembleParameters_TreeNode_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::TreeEnsembleParameters>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::TreeEnsembleParameters> *)
           _TreeEnsembleParameters_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::TreeEnsembleClassifier>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::TreeEnsembleClassifier> *)
           _TreeEnsembleClassifier_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::TreeEnsembleRegressor>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::TreeEnsembleRegressor> *)
           _TreeEnsembleRegressor_default_instance_);
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _TreeEnsembleParameters_TreeNode_EvaluationInfo_default_instance_.Shutdown();
  _TreeEnsembleParameters_TreeNode_default_instance_.Shutdown();
  _TreeEnsembleParameters_default_instance_.Shutdown();
  _TreeEnsembleClassifier_default_instance_.Shutdown();
  _TreeEnsembleRegressor_default_instance_.Shutdown();
}